

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall QPDFParser::addInt(QPDFParser *this,int count)

{
  shared_ptr<QPDFObject> obj;
  
  QPDFObject::create<QPDF_Integer,long_long&>((longlong *)&obj);
  QPDFObject::setDescription
            (obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->context,
             &this->description,this->last_offset_buffer[count % 2]);
  add(this,&obj);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFParser::addInt(int count)
{
    auto obj = QPDFObject::create<QPDF_Integer>(int_buffer[count % 2]);
    obj->setDescription(context, description, last_offset_buffer[count % 2]);
    add(std::move(obj));
}